

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_array.c
# Opt level: O0

void destroy_curious_dynamic_array(curious_dynamic_array_t *self,free_f destroy_el)

{
  void *pvVar1;
  int local_1c;
  int i;
  free_f destroy_el_local;
  curious_dynamic_array_t *self_local;
  
  if (destroy_el != (free_f)0x0) {
    for (local_1c = 0; local_1c <= self->last_el; local_1c = local_1c + 1) {
      pvVar1 = get_from_curious_dynamic_array(self,local_1c);
      (*destroy_el)(pvVar1);
    }
  }
  free(self->array);
  return;
}

Assistant:

void destroy_curious_dynamic_array(curious_dynamic_array_t* self, free_f destroy_el)
{
    if (NULL != destroy_el) {
        //destroy each element in the array...
        for (int i = 0; i <= self->last_el; ++i) {
            destroy_el(get_from_curious_dynamic_array(self, i));
        }
    }

    //...and only afterwards free the array itself
    free(self->array);
}